

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

char ** p2sc_readlines_file(char *name,int strip)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char **ppcVar3;
  int in_ESI;
  GArray *a;
  p2sc_iofile_t *f;
  char *line;
  char *local_18;
  int local_c;
  
  local_c = in_ESI;
  p2sc_open_iofile((char *)f,(char *)a);
  uVar1 = g_array_new(1,0,8);
  do {
    while( true ) {
      local_18 = p2sc_read_line((p2sc_iofile_t *)line);
      if (local_18 == (char *)0x0) {
        p2sc_free_iofile((p2sc_iofile_t *)0x10e282);
        ppcVar3 = (char **)g_array_free(uVar1,0);
        return ppcVar3;
      }
      if (local_c != 0) break;
LAB_0010e263:
      g_array_append_vals(uVar1,&local_18,1);
    }
    uVar2 = g_strchug(local_18);
    local_18 = (char *)g_strchomp(uVar2);
    if (*local_18 != '\0') goto LAB_0010e263;
    g_free(local_18);
  } while( true );
}

Assistant:

char **p2sc_readlines_file(const char *name, int strip) {
    char *line;
    p2sc_iofile_t *f = p2sc_open_iofile(name, "r");
    GArray *a = g_array_new(TRUE, FALSE, sizeof(char *));

    while ((line = p2sc_read_line(f))) {
        if (strip) {
            line = g_strstrip(line);
            if (!*line) {
                g_free(line);
                continue;
            }
        }
        g_array_append_val(a, line);
    }

    p2sc_free_iofile(f);

    return (char **) g_array_free(a, FALSE);
}